

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

RepeatedField<unsigned_int> * __thiscall
google::protobuf::internal::GeneratedMessageReflection::
GetRaw<google::protobuf::RepeatedField<unsigned_int>>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  RepeatedField<unsigned_int> *pRVar3;
  
  if (*(long *)(field + 0x60) != 0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      pRVar3 = (RepeatedField<unsigned_int> *)
               ReflectionSchema::GetFieldDefault(&this->schema_,field);
      return pRVar3;
    }
  }
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (RepeatedField<unsigned_int> *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}